

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void extract_reference_file(char *name)

{
  uint uVar1;
  byte *pbVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  FILE *__stream_00;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  byte *local_448;
  char buff [1024];
  
  sprintf(buff,"%s/%s.uu",refdir,name);
  __stream = fopen(buff,"r");
  failure("Couldn\'t open reference file %s",buff);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/main.c"
                   ,L'ࢊ',(uint)(__stream != (FILE *)0x0),"in != NULL",(void *)0x0);
  if (__stream != (FILE *)0x0) {
    do {
      pcVar4 = fgets(buff,0x400,__stream);
      if (pcVar4 == (char *)0x0) {
        return;
      }
      iVar3 = bcmp(buff,"begin ",6);
    } while (iVar3 != 0);
    __stream_00 = fopen(name,"wb");
    while( true ) {
      pcVar4 = fgets(buff,0x400,__stream);
      if ((pcVar4 == (char *)0x0) || (iVar3 = bcmp(buff,"end",3), iVar3 == 0)) break;
      uVar1 = (byte)buff[0] & 0x3f ^ 0x20;
      pbVar2 = (byte *)(buff + 1);
      while (local_448 = pbVar2, uVar7 = uVar1, uVar7 != 0) {
        uVar5 = (local_448[1] & 0x3f ^ 0x20) << 0xc;
        fputc(((*local_448 & 0x3f ^ 0x20) << 0x12 | uVar5) >> 0x10,__stream_00);
        uVar1 = 0;
        pbVar2 = local_448 + 2;
        if (uVar7 != 1) {
          uVar6 = (local_448[2] & 0x3f ^ 0x20) << 6;
          fputc((uVar5 | uVar6) >> 8 & 0xff,__stream_00);
          uVar1 = 0;
          pbVar2 = local_448 + 3;
          if (uVar7 != 2) {
            fputc((uVar6 & 0xff | local_448[3] & 0x3f) ^ 0x20,__stream_00);
            uVar1 = uVar7 - 3;
            pbVar2 = local_448 + 4;
          }
        }
      }
    }
    fclose(__stream_00);
    fclose(__stream);
  }
  return;
}

Assistant:

void
extract_reference_file(const char *name)
{
	char buff[1024];
	FILE *in, *out;

	sprintf(buff, "%s/%s.uu", refdir, name);
	in = fopen(buff, "r");
	failure("Couldn't open reference file %s", buff);
	assert(in != NULL);
	if (in == NULL)
		return;
	/* Read up to and including the 'begin' line. */
	for (;;) {
		if (fgets(buff, sizeof(buff), in) == NULL) {
			/* TODO: This is a failure. */
			return;
		}
		if (memcmp(buff, "begin ", 6) == 0)
			break;
	}
	/* Now, decode the rest and write it. */
	/* Not a lot of error checking here; the input better be right. */
	out = fopen(name, "wb");
	while (fgets(buff, sizeof(buff), in) != NULL) {
		char *p = buff;
		int bytes;

		if (memcmp(buff, "end", 3) == 0)
			break;

		bytes = UUDECODE(*p++);
		while (bytes > 0) {
			int n = 0;
			/* Write out 1-3 bytes from that. */
			if (bytes > 0) {
				n = UUDECODE(*p++) << 18;
				n |= UUDECODE(*p++) << 12;
				fputc(n >> 16, out);
				--bytes;
			}
			if (bytes > 0) {
				n |= UUDECODE(*p++) << 6;
				fputc((n >> 8) & 0xFF, out);
				--bytes;
			}
			if (bytes > 0) {
				n |= UUDECODE(*p++);
				fputc(n & 0xFF, out);
				--bytes;
			}
		}
	}
	fclose(out);
	fclose(in);
}